

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monotonicity.cpp
# Opt level: O2

void __thiscall FMB::Monotonicity::monotone(Monotonicity *this,Clause *c,Literal *l)

{
  SATLiteral SVar1;
  uint uVar2;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 *paVar3;
  ulong uVar4;
  DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  long lVar5;
  uint i;
  uint uVar6;
  
  uVar6 = (l->super_Term)._functor;
  uVar4 = (l->super_Term)._args[0]._content;
  if (uVar6 == 0) {
    if ((uVar4 & 4) != 0) {
      uVar4 = (ulong)(*(uint *)&(l->super_Term).field_0xc & 0xfffffff);
      safe(this,c,l,(l->super_Term)._args + uVar4);
      safe(this,c,l,(l->super_Term)._args + (uVar4 - 1));
      return;
    }
  }
  else {
    this_00 = &this->_pF;
    if ((uVar4 & 4) == 0) {
      this_00 = &this->_pT;
    }
    paVar3 = &Lib::DHMap<unsigned_int,_SAT::SATLiteral,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                        (this_00,uVar6)->field_0;
    SVar1.field_0 = (anon_union_4_2_6ac8864f_for_SATLiteral_0)paVar3->_content;
    lVar5 = 0;
    for (uVar6 = 0; uVar2 = *(uint *)&(l->super_Term).field_0xc & 0xfffffff, uVar6 < uVar2;
        uVar6 = uVar6 + 1) {
      safe(this,c,l,(l->super_Term)._args + (ulong)uVar2 + lVar5,
           (SATLiteral)((uint)SVar1.field_0 ^ 1));
      lVar5 = lVar5 + -1;
    }
  }
  return;
}

Assistant:

void Monotonicity::monotone(Clause* c, Literal* l)
{
  // if we have equality
  if(l->isEquality()){
    TermList* t1 = l->nthArgument(0);
    TermList* t2 = l->nthArgument(1);
    // t1 = t2
    if(l->polarity()){
      // add a clause for each
      safe(c,l,t1);
      safe(c,l,t2);
    }
    // t1 != t2
    else{
      // the true clause, skip
    }
  }
  else{
  // not equality
    unsigned p = l->functor();
    SATLiteral add = (l->polarity() ? _pF.get(p) : _pT.get(p)).opposite();
    for(unsigned i=0;i<l->arity();i++){
      TermList* t = l->nthArgument(i);
      safe(c,l,t,add);
    }
  }
}